

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O2

void __thiscall
Connection::Connection
          (Connection *this,int client_socket,int forwarding_socket,sockaddr_in *serveraddr)

{
  uint uVar1;
  runtime_error *this_00;
  int *piVar2;
  char *__rhs;
  socklen_t __len;
  sockaddr *__addr;
  int __fd;
  allocator local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  
  __len = (socklen_t)serveraddr;
  this->kMaxTimeout = 0x80;
  this->kBufSize = 0x1000;
  this->client_socket_ = client_socket;
  this->forwarding_socket_ = forwarding_socket;
  this->data_c_f_ = 0;
  this->data_f_c_ = 0;
  this->serveraddr_ = serveraddr;
  (this->buf_cf_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->buf_cf_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->buf_cf_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->buf_fc_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->buf_fc_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->buf_fc_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->connected = false;
  this->active_ = true;
  uVar1 = fcntl(forwarding_socket,3,0);
  fcntl(forwarding_socket,4,(ulong)(uVar1 | 0x800));
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&local_68,this->kBufSize,
             (allocator_type *)&local_48);
  std::vector<char,_std::allocator<char>_>::_M_move_assign(&this->buf_cf_,&local_68);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            ((_Vector_base<char,_std::allocator<char>_> *)&local_68);
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&local_68,this->kBufSize,
             (allocator_type *)&local_48);
  pbVar3 = &local_68;
  std::vector<char,_std::allocator<char>_>::_M_move_assign(&this->buf_fc_);
  __fd = (int)pbVar3;
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            ((_Vector_base<char,_std::allocator<char>_> *)&local_68);
  if (this->forwarding_socket_ != -1) {
    connect(this,__fd,__addr,__len);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string((string *)&local_48,"socket: ",&local_69);
  piVar2 = __errno_location();
  __rhs = strerror(*piVar2);
  std::operator+(&local_68,&local_48,__rhs);
  std::runtime_error::runtime_error(this_00,(string *)&local_68);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Connection::Connection(int client_socket, int forwarding_socket, sockaddr_in *serveraddr) :
        connected(false),
        forwarding_socket_(forwarding_socket),
        serveraddr_(serveraddr),
        client_socket_(client_socket),
        kMaxTimeout(128),
        kBufSize(4096),
        data_c_f_(0),
        data_f_c_(0),
        active_(true) {
    fcntl(forwarding_socket_, F_SETFL, fcntl(forwarding_socket_, F_GETFL, 0) | O_NONBLOCK);
    buf_cf_ = std::vector<char>(kBufSize);
    buf_fc_ = std::vector<char>(kBufSize);
    if (forwarding_socket_ == -1) {
        throw std::runtime_error(std::string("socket: ") + strerror(errno));
    }
    connect();
}